

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O2

int main(void)

{
  uint __line;
  bool bVar1;
  byte bVar2;
  char *__assertion;
  array<unsigned_char,_1UL> local_5b;
  array<unsigned_char,_1UL> local_5a;
  flags_storage<3UL> local_59;
  typed_flags<eats_meat,eats_grass,has_tail> local_58 [2];
  array<unsigned_char,_1UL> local_56 [2];
  typed_flags<eats_meat,eats_grass,has_tail> local_54;
  typed_flags<eats_meat,_eats_grass,_has_tail> a3;
  typed_flags<eats_meat,_eats_grass,_has_tail> a2;
  typed_flags<eats_meat,_eats_grass,_has_tail> a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_5a._M_elems[0] = (_Type)'\0';
  tfl::detail::flags_storage<3ul>::to_string<char,std::char_traits<char>,std::allocator<char>>
            (&local_50,(flags_storage<3ul> *)&local_5a,'0','1');
  bVar1 = std::operator==(&local_50,"000");
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_50);
    local_5a._M_elems[0] = (_Type)((byte)local_5a._M_elems[0] | 1);
    tfl::detail::flags_storage<3ul>::to_string<char,std::char_traits<char>,std::allocator<char>>
              (&local_50,(flags_storage<3ul> *)&local_5a,'0','1');
    bVar1 = std::operator==(&local_50,"001");
    if (bVar1) {
      std::__cxx11::string::~string((string *)&local_50);
      local_5a._M_elems[0] = (_Type)((byte)local_5a._M_elems[0] | 2);
      tfl::detail::flags_storage<3ul>::to_string<char,std::char_traits<char>,std::allocator<char>>
                (&local_50,(flags_storage<3ul> *)&local_5a,'-','1');
      bVar1 = std::operator==(&local_50,"-11");
      if (bVar1) {
        std::__cxx11::string::~string((string *)&local_50);
        bVar2 = (byte)local_5a._M_elems[0] & 0xf9;
        local_5a._M_elems[0] = (_Type)(bVar2 + 4);
        if (bVar2 == 1) {
          tfl::detail::flags_storage<3ul>::
          to_string<char,std::char_traits<char>,std::allocator<char>>
                    (&local_50,(flags_storage<3ul> *)&local_5a,'-','+');
          bVar1 = std::operator==(&local_50,"+-+");
          if (bVar1) {
            std::__cxx11::string::~string((string *)&local_50);
            local_59.m_data._M_elems[0] = (array<unsigned_char,_1UL>)(_Type)0x6;
            local_5b._M_elems[0] = (_Type)'\0';
            bVar1 = tfl::detail::flags_storage<3UL>::none((flags_storage<3UL> *)&local_5b);
            if (bVar1) {
              bVar1 = tfl::detail::flags_storage<3UL>::any((flags_storage<3UL> *)&local_5b);
              if (bVar1) {
                __assertion = "!unknown.any()";
                __line = 0x45;
              }
              else {
                bVar1 = tfl::detail::flags_storage<3UL>::all((flags_storage<3UL> *)&local_5b);
                if (bVar1) {
                  __assertion = "!unknown.all()";
                  __line = 0x46;
                }
                else {
                  local_5b._M_elems[0] = (_Type)'\a';
                  bVar1 = tfl::detail::flags_storage<3UL>::none((flags_storage<3UL> *)&local_5b);
                  if (bVar1) {
                    __assertion = "!unknown.none()";
                    __line = 0x49;
                  }
                  else {
                    bVar1 = tfl::detail::flags_storage<3UL>::any((flags_storage<3UL> *)&local_5b);
                    if (bVar1) {
                      bVar1 = tfl::detail::flags_storage<3UL>::all((flags_storage<3UL> *)&local_5b);
                      if (bVar1) {
                        local_56[0]._M_elems[0] = (_Type)((byte)local_5b._M_elems[0] & 0xf8);
                        bVar1 = tfl::typed_flags<eats_meat,_eats_grass,_has_tail>::operator!=
                                          ((typed_flags<eats_meat,_eats_grass,_has_tail> *)local_56,
                                           (this_type *)&local_5b);
                        if (bVar1) {
                          local_5b._M_elems[0] = (_Type)'\0';
                          bVar1 = tfl::detail::flags_storage<3UL>::is_equal
                                            ((flags_storage<3UL> *)local_56,
                                             (flags_storage<3UL> *)&local_5b);
                          if (bVar1) {
                            if ((flags_storage<3ul>)local_5b._M_elems[0] == (flags_storage<3ul>)0x0)
                            {
                              bVar1 = tfl::detail::flags_storage<3UL>::none
                                                ((flags_storage<3UL> *)&local_5b);
                              if (bVar1) {
                                bVar1 = tfl::detail::flags_storage<3UL>::any
                                                  ((flags_storage<3UL> *)&local_5b);
                                if (bVar1) {
                                  __assertion = "!unknown.any()";
                                  __line = 0x53;
                                }
                                else {
                                  bVar1 = tfl::detail::flags_storage<3UL>::all
                                                    ((flags_storage<3UL> *)&local_5b);
                                  if (bVar1) {
                                    __assertion = "!unknown.all()";
                                    __line = 0x54;
                                  }
                                  else {
                                    bVar1 = tfl::typed_flags<eats_meat,_eats_grass,_has_tail>::
                                            operator!=((typed_flags<eats_meat,_eats_grass,_has_tail>
                                                        *)&local_5b,(this_type *)&local_5a);
                                    if (bVar1) {
                                      local_5b._M_elems[0] = local_5a._M_elems[0];
                                      bVar1 = tfl::detail::flags_storage<3UL>::is_equal
                                                        ((flags_storage<3UL> *)&local_5b,
                                                         (flags_storage<3UL> *)&local_5a);
                                      if (bVar1) {
                                        if (local_5b._M_elems[0] == local_5a._M_elems[0]) {
                                          local_5b._M_elems[0] = (_Type)'\0';
                                          local_50._M_dataplus._M_p._0_1_ = 2;
                                          tfl::typed_flags<eats_meat,_eats_grass,_has_tail>::
                                          operator|=((typed_flags<eats_meat,_eats_grass,_has_tail> *
                                                     )&local_5b,(this_type *)&local_50);
                                          if (local_5b._M_elems[0] != '\x02') {
                                            __assert_fail("unknown.to_integral<int>() == 2",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                                                  ,0x86,"int main()");
                                          }
                                          local_50._M_dataplus._M_p._0_1_ = 7;
                                          tfl::typed_flags<eats_meat,_eats_grass,_has_tail>::
                                          operator^=((typed_flags<eats_meat,_eats_grass,_has_tail> *
                                                     )&local_5b,(this_type *)&local_50);
                                          if (local_5b._M_elems[0] != '\x05') {
                                            __assert_fail("unknown.to_integral<int>() == 5",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                                                  ,0x88,"int main()");
                                          }
                                          local_50._M_dataplus._M_p._0_1_ = 4;
                                          tfl::typed_flags<eats_meat,_eats_grass,_has_tail>::
                                          operator&=((typed_flags<eats_meat,_eats_grass,_has_tail> *
                                                     )&local_5b,(this_type *)&local_50);
                                          if (local_5b._M_elems[0] != '\x04') {
                                            __assert_fail("unknown.to_integral<int>() == 4",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                                                  ,0x8a,"int main()");
                                          }
                                          local_5b._M_elems[0] = (_Type)'\x06';
                                          bVar1 = tfl::detail::flags_storage<3UL>::is_equal
                                                            ((flags_storage<3UL> *)&local_5b,
                                                             &local_59);
                                          if (!bVar1) {
                                            __assert_fail("unknown == rabbit",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                                                  ,0x96,"int main()");
                                          }
                                          local_5b._M_elems[0] =
                                               (_Type)((byte)local_5b._M_elems[0] | 1);
                                          bVar1 = tfl::typed_flags<eats_meat,_eats_grass,_has_tail>
                                                  ::operator!=((
                                                  typed_flags<eats_meat,_eats_grass,_has_tail> *)
                                                  &local_5b,(this_type *)&local_59);
                                          if (!bVar1) {
                                            __assert_fail("unknown != rabbit",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                                                  ,0x98,"int main()");
                                          }
                                          local_5b._M_elems[0] =
                                               (_Type)((byte)local_5b._M_elems[0] & 0xfc | 2);
                                          bVar1 = tfl::detail::flags_storage<3UL>::is_equal
                                                            ((flags_storage<3UL> *)&local_5b,
                                                             &local_59);
                                          if (!bVar1) {
                                            __assert_fail("unknown == rabbit",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                                                  ,0x9a,"int main()");
                                          }
                                          if ((~(byte)local_5b._M_elems[0] & 6) != 0) {
                                            __assert_fail("f2 && f3",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                                                  ,0x9f,"int main()");
                                          }
                                          if (((byte)local_5b._M_elems[0] & 1) != 0) {
                                            __assert_fail("!f1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                                                  ,0xa0,"int main()");
                                          }
                                          tfl::typed_flags<eats_meat,eats_grass,has_tail>::
                                          typed_flags<char,std::char_traits<char>>
                                                    ((typed_flags<eats_meat,eats_grass,has_tail> *)
                                                     &local_50,"111",0xffffffffffffffff,'0','1');
                                          tfl::typed_flags<eats_meat,eats_grass,has_tail>::
                                          typed_flags<char,std::char_traits<char>>
                                                    (local_58,"010",0xffffffffffffffff,'0','1');
                                          a1 = tfl::operator&((
                                                  typed_flags<eats_meat,_eats_grass,_has_tail> *)
                                                  &local_50,
                                                  (typed_flags<eats_meat,_eats_grass,_has_tail> *)
                                                  local_58);
                                          tfl::detail::flags_storage<3ul>::
                                          to_string<char,std::char_traits<char>,std::allocator<char>>
                                                    (&local_50,(flags_storage<3ul> *)&a1,'0','1');
                                          bVar1 = std::operator==(&local_50,"010");
                                          if (!bVar1) {
                                            __assert_fail("a1.to_string() == \"010\"",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                                                  ,0xa3,"int main()");
                                          }
                                          std::__cxx11::string::~string((string *)&local_50);
                                          tfl::typed_flags<eats_meat,eats_grass,has_tail>::
                                          typed_flags<char,std::char_traits<char>>
                                                    ((typed_flags<eats_meat,eats_grass,has_tail> *)
                                                     &local_50,"11100",0xffffffffffffffff,'0','1');
                                          tfl::typed_flags<eats_meat,eats_grass,has_tail>::
                                          typed_flags<char,std::char_traits<char>>
                                                    (local_58,"11001",0xffffffffffffffff,'0','1');
                                          a2 = tfl::operator|((
                                                  typed_flags<eats_meat,_eats_grass,_has_tail> *)
                                                  &local_50,
                                                  (typed_flags<eats_meat,_eats_grass,_has_tail> *)
                                                  local_58);
                                          tfl::detail::flags_storage<3ul>::
                                          to_string<char,std::char_traits<char>,std::allocator<char>>
                                                    (&local_50,(flags_storage<3ul> *)&a2,'0','1');
                                          bVar1 = std::operator==(&local_50,"101");
                                          if (bVar1) {
                                            std::__cxx11::string::~string((string *)&local_50);
                                            tfl::typed_flags<eats_meat,eats_grass,has_tail>::
                                            typed_flags<char,std::char_traits<char>>
                                                      ((typed_flags<eats_meat,eats_grass,has_tail> *
                                                       )&local_50,"10",0xffffffffffffffff,'0','1');
                                            tfl::typed_flags<eats_meat,eats_grass,has_tail>::
                                            typed_flags<char,std::char_traits<char>>
                                                      (local_58,"11",0xffffffffffffffff,'0','1');
                                            a3 = tfl::operator^((
                                                  typed_flags<eats_meat,_eats_grass,_has_tail> *)
                                                  &local_50,
                                                  (typed_flags<eats_meat,_eats_grass,_has_tail> *)
                                                  local_58);
                                            tfl::detail::flags_storage<3ul>::
                                            to_string<char,std::char_traits<char>,std::allocator<char>>
                                                      (&local_50,(flags_storage<3ul> *)&a3,'0','1');
                                            bVar1 = std::operator==(&local_50,"001");
                                            if (bVar1) {
                                              std::__cxx11::string::~string((string *)&local_50);
                                              tfl::typed_flags<eats_meat,eats_grass,has_tail>::
                                              typed_flags<char,std::char_traits<char>>
                                                        (&local_54,"X",0xffffffffffffffff,'0','1');
                                              __assert_fail("false",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                                                  ,0xab,"int main()");
                                            }
                                            __assert_fail("a3.to_string() == \"001\"",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                                                  ,0xa7,"int main()");
                                          }
                                          __assert_fail("a2.to_string() == \"101\"",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                                                  ,0xa5,"int main()");
                                        }
                                        __assertion = 
                                        "unknown.to_integral<int>() == wolf.to_integral<int>()";
                                        __line = 0x58;
                                      }
                                      else {
                                        __assertion = "unknown == wolf";
                                        __line = 0x57;
                                      }
                                    }
                                    else {
                                      __assertion = "unknown != wolf";
                                      __line = 0x55;
                                    }
                                  }
                                }
                              }
                              else {
                                __assertion = "unknown.none()";
                                __line = 0x52;
                              }
                            }
                            else {
                              __assertion = "unknown.to_integral<int>() == 0";
                              __line = 0x51;
                            }
                          }
                          else {
                            __assertion = "tmp == unknown";
                            __line = 0x50;
                          }
                        }
                        else {
                          __assertion = "tmp != unknown";
                          __line = 0x4e;
                        }
                      }
                      else {
                        __assertion = "unknown.all()";
                        __line = 0x4b;
                      }
                    }
                    else {
                      __assertion = "unknown.any()";
                      __line = 0x4a;
                    }
                  }
                }
              }
            }
            else {
              __assertion = "unknown.none()";
              __line = 0x44;
            }
          }
          else {
            __assertion = "wolf.to_string(\'-\', \'+\') == \"+-+\"";
            __line = 0x39;
          }
        }
        else {
          __assertion = "wolf.to_integral<int>() == 5";
          __line = 0x38;
        }
      }
      else {
        __assertion = "wolf.to_string(\'-\') == \"-11\"";
        __line = 0x33;
      }
    }
    else {
      __assertion = "wolf.to_string() == \"001\"";
      __line = 0x30;
    }
  }
  else {
    __assertion = "wolf.to_string() == \"000\"";
    __line = 0x2d;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                ,__line,"int main()");
}

Assistant:

int main()
{    
    //typed_flags<eats_meat, eats_meat> ill_formed; // compilation error!
    
    typed_flags<> empty;
    assert( empty.size() == 0 );
    assert( sizeof(empty) == 1 );
    assert( empty.to_integral<int>() == 0 );
    assert( empty.none<>() );
    assert( !empty.any<>() );
    assert( empty.all<>() );
    empty = typed_flags<>(1);
    assert( empty.to_integral<int>() == 0 );
        
    assert( animal::index<eats_meat>() == 0 );
    assert( animal::index<eats_grass>() == 1 );
    assert( animal::index<has_tail>() == 2 );
    //animal::index<builds_spaceships>(); // compilation error!
    
    animal wolf;
    assert( wolf.size() == 3 );
    assert( sizeof(wolf) == 1 );
    assert( !wolf.test<eats_meat>() );
    assert( !wolf.test<eats_grass>() );
    assert( !wolf.test<has_tail>() );
    assert( wolf.to_string() == "000" );
    wolf.set<eats_meat>();
    assert( wolf.test<eats_meat>() );
    assert( wolf.to_string() == "001" );
    wolf.set<eats_grass>(true);
    assert( wolf.test<eats_grass>() );
    assert( wolf.to_string('-') == "-11" );
    wolf.set<eats_grass>(false);
    assert( !wolf.test<eats_grass>() );
    wolf.set<has_tail>();
    assert( wolf.test<has_tail>() );
    assert( wolf.to_integral<int>() == 5 );
    assert( wolf.to_string('-', '+') == "+-+" );
    
    animal rabbit;
    rabbit.set<eats_grass, has_tail>();
    assert( !rabbit.test<eats_meat>() );
    assert( rabbit.test<eats_grass>() );
    assert( rabbit.test<has_tail>() );
    assert( rabbit.to_integral<int>() == 6 );
    
    animal unknown;
    assert( unknown.to_integral<int>() == 0 );
    assert( unknown.none() );
    assert( !unknown.any() );
    assert( !unknown.all() );
    unknown.set();
    assert( unknown.to_integral<int>() == 7 );
    assert( !unknown.none() );
    assert( unknown.any() );
    assert( unknown.all() );
    animal tmp = unknown;
    tmp.reset<eats_meat, eats_grass, has_tail>();
    assert( tmp != unknown );
    unknown.reset();
    assert( tmp == unknown );
    assert( unknown.to_integral<int>() == 0 );
    assert( unknown.none() );
    assert( !unknown.any() );
    assert( !unknown.all() );
    assert( unknown != wolf );
    unknown = wolf;
    assert( unknown == wolf );
    assert( unknown.to_integral<int>() == wolf.to_integral<int>() );
    
    human engineer;
    assert( (engineer.none<eats_meat>()) );
    assert( (engineer.none<eats_meat, eats_grass>()) );
    assert( (engineer.none<eats_meat, eats_grass, builds_spaceships>()) );
    assert( (!engineer.any<eats_meat>()) );
    assert( (!engineer.any<eats_meat, eats_grass>()) );
    assert( (!engineer.any<eats_meat, eats_grass, builds_spaceships>()) );
    assert( (!engineer.all<eats_meat>()) );
    assert( (!engineer.all<eats_meat, eats_grass>()) );
    assert( (!engineer.all<eats_meat, eats_grass, builds_spaceships>()) );
    engineer.set<builds_spaceships>();
    assert( engineer.to_integral<int>() == 4 );
    assert( (engineer.none<eats_meat>()) );
    assert( (engineer.none<eats_meat, eats_grass>()) );
    assert( (!engineer.none<eats_meat, eats_grass, builds_spaceships>()) );
    assert( (!engineer.any<eats_meat>()) );
    assert( (!engineer.any<eats_meat, eats_grass>()) );
    assert( (engineer.any<eats_meat, eats_grass, builds_spaceships>()) );
    assert( (!engineer.all<eats_meat>()) );
    assert( (!engineer.all<eats_meat, eats_grass>()) );
    assert( (!engineer.all<eats_meat, eats_grass, builds_spaceships>()) );
    engineer.flip<eats_meat, eats_grass, builds_spaceships>();
    assert( (!engineer.none<eats_meat>()) );
    assert( (!engineer.none<eats_meat, eats_grass>()) );
    assert( (!engineer.none<eats_meat, eats_grass, builds_spaceships>()) );
    assert( (engineer.any<eats_meat>()) );
    assert( (engineer.any<eats_meat, eats_grass>()) );
    assert( (engineer.any<eats_meat, eats_grass, builds_spaceships>()) );
    assert( (engineer.all<eats_meat>()) );
    assert( (engineer.all<eats_meat, eats_grass>()) );
    assert( (!engineer.all<eats_meat, eats_grass, builds_spaceships>()) );
    engineer.flip();
    assert( !engineer.test<eats_meat>() );
    assert( !engineer.test<eats_grass>() );
    assert( engineer.test<builds_spaceships>() );
    assert( engineer.to_integral<int>() == 4 );
    
    //engineer = wolf; // compilation error!
    
    unknown = animal{65535};
    assert( unknown.to_integral<int>() == 7 );
    unknown = ~unknown;
    assert( unknown.to_integral<int>() == 0 );
    unknown |= animal{2};
    assert( unknown.to_integral<int>() == 2 );
    unknown ^= animal{7};
    assert( unknown.to_integral<int>() == 5 );
    unknown &= animal{4};
    assert( unknown.to_integral<int>() == 4 );
    
    constexpr flag<int> const_int_flag_0;
    constexpr flag<int> const_int_flag_1{1};
    flag<int> int_flag;
    assert( !int_flag && int_flag == const_int_flag_0 );
    int_flag = true;
    assert( int_flag && int_flag == const_int_flag_1 );
    int_flag = false;
    assert( !int_flag );
    
    unknown = animal{flag<has_tail>{1}, flag<eats_grass>{1}};
    assert( unknown == rabbit );
    unknown.set(flag<eats_meat>{1});
    assert( unknown != rabbit );
    unknown.set(flag<eats_meat>{0}, flag<eats_grass>{1});
    assert( unknown == rabbit );
    flag<eats_meat> f1;
    flag<eats_grass> f2;
    flag<has_tail> f3;
    unknown.get(f1, f2, f3);
    assert( f2 && f3 );
    assert( !f1 );
    
    auto a1 = animal{"111"} & animal{"010"};
    assert( a1.to_string() == "010" );
    auto a2 = animal{"11100"} | animal{"11001"};
    assert( a2.to_string() == "101" );
    auto a3 = animal{"10"} ^ animal{"11"};
    assert( a3.to_string() == "001" );
    try
    {
        animal{"X"};
        assert( false );
    }
    catch (std::invalid_argument const&)
    {
    }
    
    typed_flags<class f1, class f2, class f3, 
                class f4, class f5, class f6, 
                class f7, class f8>
                flags_8;
    assert( flags_8.size() == 8 );
    assert( sizeof(flags_8) == 1 );
    flags_8.set<class f8>();
    assert( flags_8.to_integral<int>() == 128 );
    assert( flags_8.to_string() == "10000000" );
    
    typed_flags<class f1, class f2, class f3, 
                class f4, class f5, class f6, 
                class f7, class f8, class f9>
                flags_9;
    assert( flags_9.size() == 9 );
    assert( sizeof(flags_9) == 2 );
    //flags_9.to_integral<uint8_t>(); // compilation error!
    flags_9.set<class f1, class f9>();
    assert( flags_9.to_integral<int>() == 257 );
    assert( flags_9.to_string() == "100000001" );
    
    return 0;
}